

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O1

bool __thiscall
jrtplib::RTCPSDESInfo::GetPrivateValue
          (RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen,uint8_t **value,size_t *valuelen)

{
  _List_node_base *__n;
  int iVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  
  p_Var2 = (this->privitems).
           super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 == (_List_node_base *)&this->privitems) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    do {
      __n = *(_List_node_base **)((long)(p_Var2[1]._M_next + 2) + 8);
      if ((__n == (_List_node_base *)prefixlen) &&
         ((__n == (_List_node_base *)0x0 ||
          (iVar1 = bcmp(prefix,p_Var2[1]._M_next[2]._M_next,(size_t)__n), iVar1 == 0)))) {
        bVar3 = true;
      }
      else {
        p_Var2 = p_Var2->_M_next;
      }
      if (bVar3) goto LAB_0012dd6d;
    } while (p_Var2 != (_List_node_base *)&this->privitems);
  }
  if (bVar3 != false) {
LAB_0012dd6d:
    p_Var2 = p_Var2[1]._M_next;
    *valuelen = (size_t)*(_List_node_base **)((long)(p_Var2 + 1) + 8);
    *value = (uint8_t *)p_Var2[1]._M_next;
  }
  return bVar3;
}

Assistant:

bool RTCPSDESInfo::GetPrivateValue(const uint8_t *prefix,size_t prefixlen,uint8_t **value,size_t *valuelen) const
{
	std::list<SDESPrivateItem *>::const_iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	if (found)
		*value = (*it)->GetInfo(valuelen);
	return found;
}